

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvd.inc.c
# Opt level: O3

_Bool trans_fle_d(DisasContext_conflict12 *ctx,arg_fle_d *a)

{
  TCGContext_conflict11 *s;
  TCGTemp *ret;
  uintptr_t o;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  TCGv_i64 local_28;
  
  if ((ctx->mstatus_fs != 0) && ((ctx->misa & 8) != 0)) {
    s = ctx->uc->tcg_ctx;
    ret = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
    local_38 = (TCGTemp *)(s->cpu_env + (long)s);
    local_30 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_fpr[a->rs1]);
    local_28 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_fpr[a->rs2]);
    tcg_gen_callN_riscv64(s,helper_fle_d_riscv64,ret,3,&local_38);
    if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != (TCGv_i64)((long)ret - (long)s))) {
      tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[a->rd]),
                          (TCGArg)ret);
    }
    tcg_temp_free_internal_riscv64(s,ret);
    return true;
  }
  return false;
}

Assistant:

static bool trans_fle_d(DisasContext *ctx, arg_fle_d *a)
{
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVD);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv t0 = tcg_temp_new(tcg_ctx);
    gen_helper_fle_d(tcg_ctx, t0, tcg_ctx->cpu_env, tcg_ctx->cpu_fpr[a->rs1], tcg_ctx->cpu_fpr[a->rs2]);
    gen_set_gpr(tcg_ctx, a->rd, t0);
    tcg_temp_free(tcg_ctx, t0);

    return true;
}